

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::BinaryExpr<obj_data_*const_&,_obj_data_*const_&>::streamReconstructedExpression
          (BinaryExpr<obj_data_*const_&,_obj_data_*const_&> *this,ostream *os)

{
  StringRef SVar1;
  obj_data **in_RDX;
  obj_data **e;
  string local_60;
  string local_40;
  
  Detail::stringify<obj_data*>(&local_40,(Detail *)this->m_lhs,in_RDX);
  SVar1 = this->m_op;
  Detail::stringify<obj_data*>(&local_60,(Detail *)this->m_rhs,e);
  Catch::formatReconstructedExpression(os,(string *)&local_40,SVar1,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }